

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O0

void jpeg_CreateCompress(j_compress_ptr cinfo,int version,size_t structsize)

{
  long lVar1;
  long lVar2;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  void *client_data;
  jpeg_error_mgr *err;
  int i;
  int local_1c;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI[1] = 0;
  if (in_ESI != 0x3e) {
    *(undefined4 *)(*in_RDI + 0x28) = 0xc;
    *(undefined4 *)(*in_RDI + 0x2c) = 0x3e;
    *(int *)(*in_RDI + 0x30) = in_ESI;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (in_RDX != 0x208) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x15;
    *(undefined4 *)(*in_RDI + 0x2c) = 0x208;
    *(int *)(*in_RDI + 0x30) = (int)in_RDX;
    (**(code **)*in_RDI)(in_RDI);
  }
  lVar1 = *in_RDI;
  lVar2 = in_RDI[3];
  memset(in_RDI,0,0x208);
  *in_RDI = lVar1;
  in_RDI[3] = lVar2;
  *(undefined4 *)(in_RDI + 4) = 0;
  jinit_memory_mgr((j_common_ptr)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  in_RDI[2] = 0;
  in_RDI[5] = 0;
  in_RDI[0xb] = 0;
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    in_RDI[(long)local_1c + 0xc] = 0;
  }
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    in_RDI[(long)local_1c + 0x10] = 0;
    in_RDI[(long)local_1c + 0x14] = 0;
  }
  in_RDI[0x3f] = 0;
  in_RDI[8] = 0x3ff0000000000000;
  *(undefined4 *)((long)in_RDI + 0x24) = 100;
  return;
}

Assistant:

GLOBAL(void)
jpeg_CreateCompress(j_compress_ptr cinfo, int version, size_t structsize)
{
  int i;

  /* Guard against version mismatches between library and caller. */
  cinfo->mem = NULL;            /* so jpeg_destroy knows mem mgr not called */
  if (version != JPEG_LIB_VERSION)
    ERREXIT2(cinfo, JERR_BAD_LIB_VERSION, JPEG_LIB_VERSION, version);
  if (structsize != sizeof(struct jpeg_compress_struct))
    ERREXIT2(cinfo, JERR_BAD_STRUCT_SIZE,
             (int)sizeof(struct jpeg_compress_struct), (int)structsize);

  /* For debugging purposes, we zero the whole master structure.
   * But the application has already set the err pointer, and may have set
   * client_data, so we have to save and restore those fields.
   * Note: if application hasn't set client_data, tools like Purify may
   * complain here.
   */
  {
    struct jpeg_error_mgr *err = cinfo->err;
    void *client_data = cinfo->client_data; /* ignore Purify complaint here */
    MEMZERO(cinfo, sizeof(struct jpeg_compress_struct));
    cinfo->err = err;
    cinfo->client_data = client_data;
  }
  cinfo->is_decompressor = FALSE;

  /* Initialize a memory manager instance for this object */
  jinit_memory_mgr((j_common_ptr)cinfo);

  /* Zero out pointers to permanent structures. */
  cinfo->progress = NULL;
  cinfo->dest = NULL;

  cinfo->comp_info = NULL;

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    cinfo->quant_tbl_ptrs[i] = NULL;
#if JPEG_LIB_VERSION >= 70
    cinfo->q_scale_factor[i] = 100;
#endif
  }

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    cinfo->dc_huff_tbl_ptrs[i] = NULL;
    cinfo->ac_huff_tbl_ptrs[i] = NULL;
  }

#if JPEG_LIB_VERSION >= 80
  /* Must do it here for emit_dqt in case jpeg_write_tables is used */
  cinfo->block_size = DCTSIZE;
  cinfo->natural_order = jpeg_natural_order;
  cinfo->lim_Se = DCTSIZE2 - 1;
#endif

  cinfo->script_space = NULL;

  cinfo->input_gamma = 1.0;     /* in case application forgets */

  /* OK, I'm ready */
  cinfo->global_state = CSTATE_START;
}